

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * useStyledStreamWriter_abi_cxx11_(string *__return_storage_ptr__,Value *root)

{
  size_t in_RCX;
  StyledStreamWriter writer;
  ostringstream sout;
  string sStack_218;
  StyledStreamWriter local_1f8;
  allocator local_188 [376];
  
  std::__cxx11::string::string((string *)&sStack_218,"\t",local_188);
  Json::StyledStreamWriter::StyledStreamWriter(&local_1f8,&sStack_218);
  std::__cxx11::string::~string((string *)&sStack_218);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  Json::StyledStreamWriter::write(&local_1f8,(int)local_188,root,in_RCX);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  Json::StyledStreamWriter::~StyledStreamWriter(&local_1f8);
  return __return_storage_ptr__;
}

Assistant:

static std::string useStyledStreamWriter(
    Json::Value const& root)
{
  Json::StyledStreamWriter writer;
  std::ostringstream sout;
  writer.write(sout, root);
  return sout.str();
}